

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O2

bool iDynTree::stringToDoubleWithClassicLocale(string *inStr,double *outDouble)

{
  byte bVar1;
  locale alStack_198 [8];
  istringstream ss;
  byte abStack_170 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)inStr,_S_in);
  std::locale::classic();
  std::ios::imbue(alStack_198);
  std::locale::~locale(alStack_198);
  std::istream::_M_extract<double>((double *)&ss);
  bVar1 = abStack_170[*(long *)(_ss + -0x18)];
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return (bVar1 & 5) == 0;
}

Assistant:

bool inline stringToDoubleWithClassicLocale(const std::string & inStr, double & outDouble)
{
    std::istringstream ss(inStr);
    ss.imbue(std::locale::classic());
    ss >> outDouble;
    return !(ss.fail());
}